

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ColorPicker4(char *label,float *col,ImGuiColorEditFlags flags,float *ref_col)

{
  ImVec2 *out_b;
  long lVar1;
  ImGuiID id;
  ImGuiWindow *pIVar2;
  ImDrawList *pIVar3;
  ImDrawVert *pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint uVar14;
  ImU32 IVar15;
  ImU32 IVar16;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ImVec2 IVar17;
  float *out_v;
  byte bVar18;
  float *pfVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  ImGuiContext *g;
  char cVar23;
  ImVec2 *col_00;
  long lVar24;
  undefined1 __src [8];
  bool bVar25;
  uint uVar26;
  int iVar27;
  float fVar28;
  float fVar29;
  uint uVar30;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float fVar32;
  ImVec2 p_min;
  ImVec2 pos;
  undefined4 extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  ImVec2 pos_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dd;
  undefined1 extraout_var [12];
  undefined1 auVar31 [16];
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  ulong extraout_XMM0_Qb;
  ImVec2 p_max;
  ImVec2 p_max_00;
  ImVec2 half_sz;
  ImVec2 IVar33;
  ImVec2 half_sz_00;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [12];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float V;
  float B;
  float G;
  float R;
  ImVec2 triangle_pc;
  ImVec2 triangle_pa;
  ImVec2 current_off_unrotated;
  float vv;
  ImVec2 picker_pos;
  ImVec2 tra;
  float ww;
  float uu;
  float backup_initial_col [4];
  ImVec2 trc;
  ImVec2 trb;
  float local_248;
  float local_244;
  float local_240;
  uint local_23c;
  ImGuiContext *local_238;
  float local_230;
  float local_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  ImVec2 *local_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float local_1e4;
  float local_1e0;
  float local_1dc;
  ImVec2 local_1d8;
  undefined8 uStack_1d0;
  ImVec2 local_1c8;
  ImU32 local_1c0;
  uint local_1bc;
  ImVec2 local_1b8;
  ImVec2 local_1b0;
  undefined1 local_1a8 [8];
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ImDrawList *local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  float fStack_180;
  float fStack_17c;
  int local_178;
  int local_174;
  uint local_170;
  undefined1 local_168 [8];
  ImVec2 local_160;
  undefined1 local_158 [8];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  ImVec2 local_148;
  uint local_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  ImVec2 local_118;
  ImVec2 local_110;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  ImVec4 local_f0;
  ImU32 local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  size_t local_a8;
  ulong local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar43 [16];
  
  pIVar9 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar2 = pIVar9->CurrentWindow;
  if (pIVar2->SkipItems != false) {
    bVar18 = 0;
    goto LAB_002203de;
  }
  uStack_210 = local_218;
  local_218 = (undefined1  [8])ref_col;
  pIVar3 = pIVar2->DrawList;
  local_200 = (ImVec2 *)col;
  local_228._0_4_ = CalcItemWidth();
  local_228._4_4_ = extraout_XMM0_Db;
  fStack_220 = (float)extraout_XMM0_Dc;
  fStack_21c = (float)extraout_XMM0_Dd;
  (pIVar9->NextItemData).Flags = 0;
  local_1d8 = (ImVec2)label;
  PushID(label);
  BeginGroup();
  uVar22 = (uint)~flags >> 4 & 0x10 | flags;
  if ((flags & 8U) == 0) {
    ColorPickerOptionsPopup(&local_200->x,uVar22);
  }
  if ((flags & 0x6000000U) == 0) {
    uVar14 = pIVar9->ColorEditOptions & 0x6000000;
    uVar26 = 0x2000000;
    if (uVar14 != 0) {
      uVar26 = uVar14;
    }
    uVar22 = uVar22 | uVar26;
  }
  if ((uVar22 & 0x18000000) == 0) {
    uVar14 = pIVar9->ColorEditOptions & 0x18000000;
    uVar26 = 0x8000000;
    if (uVar14 != 0) {
      uVar26 = uVar14;
    }
    uVar22 = uVar22 | uVar26;
  }
  if ((uVar22 & 8) == 0) {
    uVar22 = uVar22 | pIVar9->ColorEditOptions & 0x10000U;
  }
  local_1bc = uVar22 & 0x10002;
  bVar25 = local_1bc == 0x10000;
  IVar33 = (pIVar2->DC).CursorPos;
  local_198 = pIVar3;
  local_148 = IVar33;
  local_158._0_4_ = GetFrameHeight();
  col_00 = local_200;
  register0x00001204 = extraout_var;
  pfVar19 = (float *)0x0;
  local_238 = pIVar9;
  fVar38 = (pIVar9->Style).ItemInnerSpacing.x;
  local_128 = ZEXT416((uint)fVar38);
  fVar38 = local_228._0_4_ - ((float)local_158._0_4_ + fVar38) * (float)(byte)(bVar25 + 1);
  uVar26 = -(uint)(fVar38 <= (float)local_158._0_4_);
  auVar45._0_4_ = uVar26 & local_158._0_4_;
  auVar45._4_4_ = local_228._4_4_ & extraout_var._0_4_;
  auVar45._8_4_ = local_228._8_4_ & extraout_var._4_4_;
  auVar45._12_4_ = local_228._12_4_ & extraout_var._8_4_;
  _local_1a8 = auVar45 | ZEXT416(~uVar26 & (uint)fVar38);
  local_a8 = (ulong)((uVar22 & 2) == 0) * 4 + 0xc;
  out_v = (float *)0x0;
  __memcpy_chk(local_58,local_200,local_a8,0x10);
  local_22c = (float)local_1a8._0_4_ * 0.08;
  local_98 = ZEXT416((uint)((float)local_1a8._0_4_ * 0.5));
  local_1b0.x = (float)local_1a8._0_4_ * 0.5 - local_22c;
  _local_b8 = ZEXT416((uint)local_1b0.x);
  local_230 = IVar33.x;
  local_78 = (float)local_1a8._0_4_ + local_230;
  fStack_74 = (float)local_1a8._4_4_;
  uStack_70 = uStack_1a0;
  uStack_6c = uStack_19c;
  _fStack_1f0 = 0;
  local_1f8._0_4_ = IVar33.x;
  local_1f8._4_4_ = IVar33.y;
  local_108._0_4_ = ((float)local_158._0_4_ + (float)local_1a8._0_4_) * 0.5 + local_230;
  local_108._4_4_ = (float)local_1a8._0_4_ * 0.5 + IVar33.y;
  fStack_100 = (float)local_158._4_4_ * 0.0 + 0.0;
  fStack_fc = (float)local_1a8._4_4_ * 0.0 + 0.0;
  local_1c8.y = (float)local_108._4_4_;
  local_1c8.x = (float)local_108._0_4_;
  local_1b0.x = local_1b0.x - (float)(int)((float)local_1a8._0_4_ * 0.027);
  local_190.x = local_1b0.x * -0.5;
  local_190.y = local_1b0.x * -0.866025;
  local_1b0.y = 0.0;
  local_1b8.y = local_1b0.x * 0.866025;
  local_248 = col_00->x;
  local_244 = col_00->y;
  local_240 = col_00[1].x;
  local_228._4_4_ = local_128._4_4_;
  local_228._0_4_ = (float)local_128._0_4_ + local_78;
  fStack_220 = (float)local_128._8_4_;
  fStack_21c = (float)local_128._12_4_;
  local_1e4 = local_240;
  local_1e0 = local_244;
  local_1dc = local_248;
  local_1b8.x = local_190.x;
  if ((uVar22 >> 0x1b & 1) == 0) {
    __src = local_218;
    fVar38 = (float)local_128._0_4_ + local_78;
    if ((uVar22 >> 0x1c & 1) != 0) {
      ColorConvertHSVtoRGB(local_248,local_244,local_240,&local_1dc,&local_1e0,&local_1e4);
      fVar38 = (float)local_228._0_4_;
    }
  }
  else {
    pfVar19 = &local_244;
    out_v = &local_240;
    ColorConvertRGBtoHSV(local_248,local_244,local_240,&local_248,pfVar19,out_v);
    ColorEditRestoreHS(&col_00->x,&local_248,pfVar19,out_v);
    __src = local_218;
    fVar38 = (float)local_228._0_4_;
  }
  local_218._4_4_ = local_158._4_4_;
  local_218._0_4_ = (float)local_158._0_4_ + fVar38;
  uStack_210._0_4_ = (float)uStack_150;
  uStack_210._4_4_ = (float)uStack_14c;
  PushItemFlag(8,true);
  if ((uVar22 >> 0x1a & 1) == 0) {
    if ((uVar22 >> 0x19 & 1) == 0) {
      auVar6._12_4_ = 0;
      auVar6._0_12_ = local_138._4_12_;
      local_138 = auVar6 << 0x20;
      local_23c = 0;
      uVar20 = 0;
    }
    else {
      local_188.y = (float)local_1a8._0_4_;
      local_188.x = (float)local_1a8._0_4_;
      auVar8._12_4_ = 0;
      auVar8._0_12_ = local_138._4_12_;
      local_138 = auVar8 << 0x20;
      InvisibleButton("sv",&local_188,0);
      bVar25 = IsItemActive();
      if (bVar25) {
        auVar31._0_4_ = (float)local_1a8._0_4_ + -1.0;
        IVar33 = (local_238->IO).MousePos;
        auVar34._0_4_ = IVar33.x - (float)local_1f8._0_4_;
        auVar34._4_4_ = IVar33.y - (float)local_1f8._4_4_;
        auVar34._8_4_ = 0.0 - fStack_1f0;
        auVar34._12_4_ = 0.0 - fStack_1ec;
        auVar31._4_4_ = auVar31._0_4_;
        auVar31._8_4_ = auVar31._0_4_;
        auVar31._12_4_ = auVar31._0_4_;
        auVar45 = divps(auVar34,auVar31);
        local_240 = 1.0;
        fVar38 = auVar45._0_4_;
        fVar28 = auVar45._4_4_;
        iVar21 = -(uint)(fVar38 < 0.0);
        iVar27 = -(uint)(fVar28 < 0.0);
        auVar44._4_4_ = iVar27;
        auVar44._0_4_ = iVar21;
        auVar44._8_4_ = iVar27;
        auVar44._12_4_ = iVar27;
        auVar43._8_8_ = auVar44._8_8_;
        auVar43._4_4_ = iVar21;
        auVar43._0_4_ = iVar21;
        uVar26 = movmskpd((int)local_238,auVar43);
        local_244 = 0.0;
        if (((uVar26 & 1) == 0) && (local_244 = 1.0, fVar38 <= 1.0)) {
          local_244 = fVar38;
        }
        if ((uVar26 & 2) == 0) {
          auVar39 = ZEXT812(0x3f800000);
          if (fVar28 <= auVar39._0_4_) {
            auVar39._4_8_ = auVar39._4_8_;
            auVar39._0_4_ = fVar28;
          }
          local_240 = 1.0 - auVar39._0_4_;
        }
        IVar16 = local_238->ColorEditLastColor;
        fStack_180 = col_00[1].x;
        local_188 = *col_00;
        fStack_17c = 0.0;
        IVar15 = ColorConvertFloat4ToU32((ImVec4 *)&local_188);
        local_138._0_4_ = (int)CONCAT71((int7)((ulong)out_v >> 8),1);
        if (IVar16 == IVar15) {
          local_248 = local_238->ColorEditLastHue;
        }
      }
      fVar38 = (float)local_1f8._4_4_;
      if ((uVar22 & 8) == 0) {
        OpenPopupOnItemClick("context",1);
        fVar38 = (float)local_1f8._4_4_;
      }
      local_188.y = fVar38;
      local_188.x = (float)local_228._0_4_;
      SetCursorScreenPos(&local_188);
      local_188.y = (float)local_1a8._0_4_;
      local_188.x = (float)local_158._0_4_;
      local_23c = 0;
      InvisibleButton("hue",&local_188,0);
      bVar25 = IsItemActive();
      if (bVar25) {
        fVar38 = ((local_238->IO).MousePos.y - (float)local_1f8._4_4_) /
                 ((float)local_1a8._0_4_ + -1.0);
        local_248 = 1.0;
        if (fVar38 <= 1.0) {
          local_248 = fVar38;
        }
        local_248 = (float)(~-(uint)(fVar38 < 0.0) & (uint)local_248);
        local_23c = (uint)CONCAT71((int7)((ulong)local_238 >> 8),1);
        uVar20 = CONCAT71((int7)((ulong)pfVar19 >> 8),1);
      }
      else {
        uVar20 = (ulong)(uint)local_138._0_4_;
      }
    }
  }
  else {
    local_188.y = (float)local_1a8._0_4_;
    local_188.x = (local_238->Style).ItemInnerSpacing.x + (float)local_1a8._0_4_ +
                  (float)local_158._0_4_;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = local_138._4_12_;
    local_138 = auVar7 << 0x20;
    InvisibleButton("hsv",&local_188,0);
    bVar25 = IsItemActive();
    local_23c = 0;
    uVar20 = 0;
    if (bVar25) {
      fVar46 = (local_238->IO).MouseClickedPos[0].x - (float)local_108._0_4_;
      fVar42 = (local_238->IO).MouseClickedPos[0].y - (float)local_108._4_4_;
      fVar28 = (local_238->IO).MousePos.x - (float)local_108._0_4_;
      local_d8 = ZEXT416((uint)fVar28);
      fVar38 = (local_238->IO).MousePos.y - (float)local_108._4_4_;
      local_138 = ZEXT416((uint)fVar38);
      local_c8 = ZEXT416((uint)fVar42);
      local_88 = ZEXT416((uint)fVar46);
      fVar42 = fVar46 * fVar46 + fVar42 * fVar42;
      if ((fVar42 < ((float)local_b8._0_4_ + -1.0) * ((float)local_b8._0_4_ + -1.0)) ||
         (((float)local_98._0_4_ + 1.0) * ((float)local_98._0_4_ + 1.0) < fVar42)) {
        local_23c = 0;
      }
      else {
        fVar38 = atan2f(fVar38,fVar28);
        fVar38 = (fVar38 / 3.1415927) * 0.5;
        local_248 = (float)(~-(uint)(fVar38 < 0.0) & (uint)fVar38 |
                           (uint)(fVar38 + 1.0) & -(uint)(fVar38 < 0.0));
        local_23c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      }
      local_108._0_4_ = cosf(local_248 * -2.0 * 3.1415927);
      local_108._4_4_ = extraout_XMM0_Db_00;
      fStack_100 = (float)extraout_XMM0_Dc_00;
      fStack_fc = (float)extraout_XMM0_Dd_00;
      fVar38 = sinf(local_248 * -2.0 * 3.1415927);
      fVar28 = -(float)local_c8._0_4_;
      fVar42 = (float)local_108._0_4_ * (float)local_c8._0_4_;
      local_c8._4_4_ = extraout_XMM0_Db_01;
      local_c8._0_4_ = fVar38;
      local_c8._8_4_ = extraout_XMM0_Dc_01;
      local_c8._12_4_ = extraout_XMM0_Dd_01;
      local_188.x = (float)local_108._0_4_ * (float)local_88._0_4_ + fVar28 * fVar38;
      local_188.y = fVar38 * (float)local_88._0_4_ + fVar42;
      bVar25 = ImTriangleContainsPoint(&local_1b0,&local_190,&local_1b8,&local_188);
      if (bVar25) {
        local_188.x = (float)local_108._0_4_ * (float)local_d8._0_4_ +
                      -(float)local_138._0_4_ * (float)local_c8._0_4_;
        local_188.y = (float)local_c8._0_4_ * (float)local_d8._0_4_ +
                      (float)local_108._0_4_ * (float)local_138._0_4_;
        bVar25 = ImTriangleContainsPoint(&local_1b0,&local_190,&local_1b8,&local_188);
        if (!bVar25) {
          local_188 = ImTriangleClosestPoint(&local_1b0,&local_190,&local_1b8,&local_188);
        }
        ImTriangleBarycentricCoords
                  (&local_1b0,&local_190,&local_1b8,&local_188,&local_f0.x,(float *)local_168,
                   &local_110.x);
        fVar28 = 1.0 - (float)local_168._0_4_;
        fVar38 = 1.0;
        if (fVar28 <= 1.0) {
          fVar38 = fVar28;
        }
        local_240 = (float)(-(uint)(fVar28 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar28 < 0.0001) & (uint)fVar38);
        fVar28 = local_f0.x / local_240;
        fVar38 = 1.0;
        if (fVar28 <= 1.0) {
          fVar38 = fVar28;
        }
        local_244 = (float)(-(uint)(fVar28 < 0.0001) & 0x38d1b717 |
                           ~-(uint)(fVar28 < 0.0001) & (uint)fVar38);
        local_138._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
        uVar20 = 1;
      }
      else {
        auVar5._12_4_ = 0;
        auVar5._0_12_ = local_138._4_12_;
        local_138 = auVar5 << 0x20;
        uVar20 = (ulong)local_23c;
      }
    }
    if ((uVar22 & 8) == 0) {
      OpenPopupOnItemClick("context",1);
    }
  }
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_218._0_4_;
  if (local_1bc == 0x10000) {
    local_188.y = (float)local_1f8._4_4_;
    local_188.x = (float)local_128._0_4_;
    SetCursorScreenPos(&local_188);
    local_188.y = (float)local_1a8._0_4_;
    local_188.x = (float)local_158._0_4_;
    InvisibleButton("alpha",&local_188,0);
    bVar25 = IsItemActive();
    if (bVar25) {
      fVar28 = ((local_238->IO).MousePos.y - (float)local_1f8._4_4_) /
               ((float)local_1a8._0_4_ + -1.0);
      fVar38 = 1.0;
      if (fVar28 <= 1.0) {
        fVar38 = fVar28;
      }
      col_00[1].y = (float)(-(uint)(fVar28 < 0.0) & 0x3f800000 |
                           ~-(uint)(fVar28 < 0.0) & (uint)(1.0 - fVar38));
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
    }
  }
  PopItemFlag();
  if ((uVar22 >> 8 & 1) == 0) {
    SameLine(0.0,(local_238->Style).ItemInnerSpacing.x);
    BeginGroup();
  }
  IVar33 = local_1d8;
  if (-1 < (char)uVar22) {
    local_108._0_4_ = uVar22;
    IVar17 = (ImVec2)FindRenderedTextEnd((char *)local_1d8,(char *)0x0);
    uVar22 = local_108._0_4_;
    if (IVar17 != IVar33) {
      if (((uint)local_108._0_4_ >> 8 & 1) != 0) {
        SameLine(0.0,(local_238->Style).ItemInnerSpacing.x);
      }
      TextEx((char *)local_1d8,(char *)IVar17,0);
    }
  }
  if ((uVar22 >> 8 & 1) == 0) {
    PushItemFlag(0x10,true);
    local_188 = *col_00;
    fStack_180 = col_00[1].x;
    if ((uVar22 & 2) == 0) {
      fStack_17c = col_00[1].y;
    }
    else {
      fStack_17c = 1.0;
    }
    if ((char)uVar22 < '\0') {
      Text("Current");
    }
    local_1d8.y = (float)local_158._0_4_ * 2.0;
    local_1d8.x = (float)local_158._0_4_ * 3.0;
    uStack_1d0 = CONCAT44((float)local_158._0_4_ * 0.0,(float)local_158._0_4_ * 0.0);
    local_f0.y = (float)local_158._0_4_ * 2.0;
    local_f0.x = (float)local_158._0_4_ * 3.0;
    ColorButton("##current",(ImVec4 *)&local_188,uVar22 & 0x180e0040,(ImVec2 *)&local_f0);
    if (__src != (undefined1  [8])0x0) {
      Text("Original");
      local_f0._0_8_ = *(undefined8 *)__src;
      local_f0.z = *(float *)((long)__src + 8);
      if ((uVar22 & 2) == 0) {
        local_f0.w = *(float *)((long)((long)__src + 8) + 4);
      }
      else {
        local_f0.w = 1.0;
      }
      local_168._0_4_ = local_1d8.x;
      local_168._4_4_ = local_1d8.y;
      bVar25 = ColorButton("##original",&local_f0,uVar22 & 0x180e0040,(ImVec2 *)local_168);
      if (bVar25) {
        memcpy(col_00,(void *)__src,local_a8);
        uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
      }
    }
    PopItemFlag();
    EndGroup();
  }
  uVar26 = (uint)uVar20;
  fVar38 = (float)local_158._0_4_ * 0.2;
  fVar28 = 0.0;
  fVar42 = 0.0;
  fVar46 = 0.0;
  pfVar19 = &col_00->y;
  out_b = col_00 + 1;
  if (((char)local_23c != '\0') || (local_138[0] != '\0')) {
    if ((uVar22 >> 0x1b & 1) == 0) {
      if ((uVar22 >> 0x1c & 1) != 0) {
        col_00->x = local_248;
        col_00->y = local_244;
        col_00[1].x = local_240;
      }
    }
    else {
      local_1d8.y = 0.0;
      local_1d8.x = fVar38;
      uStack_1d0 = 0;
      ColorConvertHSVtoRGB(local_248,local_244,local_240,&col_00->x,pfVar19,&out_b->x);
      pIVar9 = local_238;
      local_238->ColorEditLastHue = local_248;
      local_238->ColorEditLastSat = local_244;
      fStack_180 = col_00[1].x;
      local_188 = *col_00;
      fStack_17c = 0.0;
      IVar16 = ColorConvertFloat4ToU32((ImVec4 *)&local_188);
      pIVar9->ColorEditLastColor = IVar16;
      fVar38 = local_1d8.x;
      fVar28 = local_1d8.y;
      fVar42 = (float)uStack_1d0;
      fVar46 = uStack_1d0._4_4_;
    }
  }
  fVar29 = (float)(int)fVar38;
  fVar32 = (float)(int)fVar28;
  iVar21 = (int)fVar42;
  iVar27 = (int)fVar46;
  if ((uVar22 & 0x20) == 0) {
    local_1d8.y = (float)(int)fVar28;
    local_1d8.x = (float)(int)fVar38;
    uStack_1d0 = CONCAT44((int)fVar46,(int)fVar42);
    uVar20 = uVar20 & 0xffffffff;
    fVar38 = (float)local_128._0_4_;
    if (local_1bc != 0x10000) {
      fVar38 = (float)local_228._0_4_;
    }
    PushItemWidth((fVar38 + (float)local_158._0_4_) - local_230);
    uVar14 = uVar22 & 0x198e001a;
    cVar23 = '\x01';
    if (((uVar22 >> 0x14 & 1) != 0 || (uVar22 & 0x600000) == 0) &&
       (bVar25 = ColorEdit4("##rgb",&local_200->x,uVar14 | 0x100004), bVar25)) {
      uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
      if (local_238->ActiveId == 0) {
        cVar23 = '\x01';
      }
      else {
        cVar23 = local_238->ActiveIdAllowOverlap;
      }
    }
    if ((uVar22 >> 0x15 & 1) != 0 || (uVar22 & 0x500000) == 0) {
      bVar25 = ColorEdit4("##hsv",&local_200->x,uVar14 | 0x200004);
      uVar20 = CONCAT71((int7)(uVar20 >> 8),(byte)uVar20 | bVar25);
    }
    uVar26 = (uint)uVar20;
    if ((uVar22 >> 0x16 & 1) != 0 || (uVar22 & 0x300000) == 0) {
      bVar25 = ColorEdit4("##hex",&local_200->x,uVar14 | 0x400004);
      uVar26 = (uint)CONCAT71((int7)(uVar20 >> 8),(byte)uVar20 | bVar25);
    }
    PopItemWidth();
    col_00 = local_200;
    if ((uVar22 >> 0x1b & 1) != 0 && cVar23 == '\0') {
      ColorConvertRGBtoHSV
                (local_200->x,local_200->y,local_200[1].x,&local_188.x,&local_f0.x,
                 (float *)local_168);
      if ((local_188.x <= 0.0) && (0.0 < local_248)) {
        if (0.0 < (float)local_168._0_4_) {
LAB_0021f683:
          if (0.0 < local_f0.x) goto LAB_0021f6a6;
          fVar38 = local_244 * 0.5;
          fVar28 = (float)local_168._0_4_;
        }
        else {
          if ((local_240 == (float)local_168._0_4_) &&
             (!NAN(local_240) && !NAN((float)local_168._0_4_))) goto LAB_0021f683;
          fVar38 = local_244;
          fVar28 = local_240 * 0.5;
        }
        ColorConvertHSVtoRGB(local_248,fVar38,fVar28,&col_00->x,pfVar19,&out_b->x);
      }
    }
LAB_0021f6a6:
    fVar29 = local_1d8.x;
    fVar32 = local_1d8.y;
    iVar21 = (int)(float)uStack_1d0;
    iVar27 = (int)uStack_1d0._4_4_;
  }
  local_68 = (float)(int)fVar29;
  fStack_64 = (float)(int)fVar32;
  fStack_60 = (float)iVar21;
  fStack_5c = (float)iVar27;
  if ((char)uVar26 != '\0') {
    if ((uVar22 >> 0x1b & 1) == 0) {
      if ((uVar22 >> 0x1c & 1) != 0) {
        local_248 = col_00->x;
        local_244 = col_00->y;
        local_240 = col_00[1].x;
        ColorConvertHSVtoRGB(local_248,local_244,local_240,&local_1dc,&local_1e0,&local_1e4);
      }
    }
    else {
      local_1dc = col_00->x;
      local_1e0 = col_00->y;
      local_1e4 = col_00[1].x;
      ColorConvertRGBtoHSV(local_1dc,local_1e0,local_1e4,&local_248,&local_244,&local_240);
      ColorEditRestoreHS(&col_00->x,&local_248,&local_244,&local_240);
    }
  }
  pIVar9 = local_238;
  local_f0.w = (local_238->Style).Alpha;
  fVar38 = 1.0;
  if (local_f0.w <= 1.0) {
    fVar38 = local_f0.w;
  }
  iVar21 = (int)((float)(~-(uint)(local_f0.w < 0.0) & (uint)fVar38) * 255.0 + 0.5);
  local_f0.x = 1.0;
  local_f0.y = 1.0;
  local_f0.z = 1.0;
  uVar14 = iVar21 * 0x1000000;
  local_a0 = (ulong)uVar14;
  local_178 = uVar14 + 0xff0000;
  uVar30 = iVar21 << 0x18;
  local_170 = uVar30 | 0xff;
  fStack_180 = (float)(iVar21 << 0x18 | 0xff00);
  fStack_17c = (float)(iVar21 << 0x18 | 0xffff00);
  local_1d8 = (ImVec2)(CONCAT44(iVar21 << 0x18,uVar30) | 0xffff000000ff);
  uStack_1d0 = CONCAT44(iVar21 << 0x18,iVar21 << 0x18) | 0xffff000000ff00;
  local_230 = (float)(uVar14 + 0xffffff);
  local_188 = (ImVec2)(CONCAT44(iVar21 << 0x18,uVar30) | 0xffff000000ff);
  local_174 = uVar14 + 0xff00ff;
  local_d8._0_4_ = uVar14 + 0x808080;
  local_13c = uVar26;
  ColorConvertHSVtoRGB(local_248,1.0,1.0,&local_f0.x,&local_f0.y,&local_f0.z);
  IVar15 = ColorConvertFloat4ToU32(&local_f0);
  local_168._4_4_ = local_1e0;
  local_168._0_4_ = local_1dc;
  local_160.y = (pIVar9->Style).Alpha;
  local_160.x = local_1e4;
  IVar16 = ColorConvertFloat4ToU32((ImVec4 *)local_168);
  pIVar3 = local_198;
  fVar38 = local_1d8.x;
  local_110.x = 0.0;
  local_110.y = 0.0;
  if ((uVar22 >> 0x1a & 1) == 0) {
    if ((uVar22 >> 0x19 & 1) != 0) {
      local_168._4_4_ = (float)local_1f8._4_4_ + (float)local_1a8._0_4_;
      local_168._0_4_ = local_78;
      local_1c0 = IVar16;
      ImDrawList::AddRectFilledMultiColor
                (local_198,&local_148,(ImVec2 *)local_168,(ImU32)local_230,IVar15,IVar15,
                 (ImU32)local_230);
      local_1f8._4_4_ = local_1a8._0_4_;
      local_1f8._0_4_ = local_1a8._0_4_;
      fStack_1f0 = (float)local_1a8._0_4_;
      fStack_1ec = (float)local_1a8._0_4_;
      local_168._0_4_ = local_148.x + (float)local_1a8._0_4_;
      local_168._4_4_ = local_148.y + (float)local_1a8._0_4_;
      ImDrawList::AddRectFilledMultiColor
                (pIVar3,&local_148,(ImVec2 *)local_168,0,0,(ImU32)local_a0,(ImU32)local_a0);
      p_max.x = (float)local_1f8._0_4_ + local_148.x;
      p_max.y = (float)local_1f8._4_4_ + local_148.y;
      RenderFrameBorder(local_148,p_max,0.0);
      auVar40._4_4_ = 1.0 - local_240;
      auVar40._0_4_ = local_244;
      auVar40._8_8_ = 0;
      auVar45 = minps(_DAT_0024aa90,auVar40);
      fVar28 = local_148.x;
      fVar42 = local_148.y;
      auVar35._0_4_ =
           (float)(int)((float)(-(uint)(0.0 <= local_244) & auVar45._0_4_) * (float)local_1f8._0_4_
                        + fVar28 + 0.5);
      auVar35._4_4_ =
           (float)(int)((float)(-(uint)(0.0 <= 1.0 - local_240) & auVar45._4_4_) *
                        (float)local_1f8._4_4_ + fVar42 + 0.5);
      auVar35._8_4_ = (float)(int)(auVar45._8_4_ * fStack_1f0 + 0.0 + 0.0);
      auVar35._12_4_ = (float)(int)(auVar45._12_4_ * fStack_1ec + 0.0 + 0.0);
      auVar41._0_4_ = (float)local_1f8._0_4_ + fVar28 + -2.0;
      auVar41._4_4_ = (float)local_1f8._4_4_ + fVar42 + -2.0;
      auVar41._8_4_ = fStack_1f0 + 0.0 + 0.0;
      auVar41._12_4_ = fStack_1ec + 0.0 + 0.0;
      auVar45 = minps(auVar41,auVar35);
      uVar22 = -(uint)(auVar35._0_4_ < fVar28 + 2.0);
      uVar26 = -(uint)(auVar35._4_4_ < fVar42 + 2.0);
      local_110 = (ImVec2)(CONCAT44(~uVar26 & auVar45._4_4_,~uVar22 & auVar45._0_4_) |
                          CONCAT44((uint)(fVar42 + 2.0) & uVar26,(uint)(fVar28 + 2.0) & uVar22));
      local_1f8._4_4_ = local_1a8._4_4_;
      local_1f8._0_4_ = (float)local_1a8._0_4_ / 6.0;
      fStack_1f0 = (float)uStack_1a0;
      fStack_1ec = (float)uStack_19c;
      lVar24 = 0;
      do {
        local_168._4_4_ = (float)(int)lVar24 * (float)local_1f8._0_4_ + local_148.y;
        local_168._0_4_ = local_228._0_4_;
        lVar1 = lVar24 + 1;
        local_118.y = (float)(int)lVar1 * (float)local_1f8._0_4_ + local_148.y;
        local_118.x = (float)local_218._0_4_;
        fVar28 = (&local_188.y)[lVar24];
        ImDrawList::AddRectFilledMultiColor
                  (pIVar3,(ImVec2 *)local_168,&local_118,(ImU32)fVar38,(ImU32)fVar38,(ImU32)fVar28,
                   (ImU32)fVar28);
        lVar24 = lVar1;
        fVar38 = fVar28;
      } while (lVar1 != 6);
      _local_1f8 = ZEXT416((uint)(float)(int)(local_248 * (float)local_1a8._0_4_ + local_148.y + 0.5
                                             ));
      p_min.y = local_148.y;
      p_min.x = (float)local_228._0_4_;
      p_max_00.y = (float)local_1a8._0_4_ + local_148.y;
      p_max_00.x = (float)local_218._0_4_;
      RenderFrameBorder(p_min,p_max_00,0.0);
      pos.x = (float)local_228._0_4_ + -1.0;
      pos.y = (float)local_1f8._0_4_;
      half_sz.x = local_68 + 1.0;
      half_sz.y = local_68;
      RenderArrowsForVerticalBar
                (pIVar3,pos,half_sz,(float)local_158._0_4_ + 2.0,(local_238->Style).Alpha);
      col_00 = local_200;
      IVar16 = local_1c0;
    }
  }
  else {
    _local_108 = ZEXT416((uint)(0.5 / (float)local_98._0_4_));
    iVar21 = 4;
    if (4 < (int)(float)local_98._0_4_ / 0xc) {
      iVar21 = (int)(float)local_98._0_4_ / 0xc;
    }
    local_c8._0_4_ = iVar21;
    local_88._4_4_ = 0x80000000;
    local_88._0_4_ = -(0.5 / (float)local_98._0_4_);
    local_88._8_4_ = 0x80000000;
    local_88._12_4_ = 0x80000000;
    local_98._0_4_ = (float)local_98._0_4_ + (float)local_b8._0_4_;
    local_78 = (float)local_98._0_4_ * 0.5;
    local_b8._4_4_ = local_b8._0_4_;
    fStack_b0 = (float)local_b8._0_4_;
    fStack_ac = (float)local_b8._0_4_;
    lVar24 = 0;
    local_1c0 = IVar16;
    local_dc = IVar15;
    do {
      fVar28 = (float)(int)lVar24 / 6.0;
      fVar28 = (fVar28 + fVar28) * 3.1415927 + (float)local_88._0_4_;
      local_1d8.x = fVar28;
      fVar42 = ((float)(int)lVar24 + 1.0) / 6.0;
      fVar42 = (fVar42 + fVar42) * 3.1415927 + (float)local_108._0_4_;
      local_1f8._0_4_ = fVar42;
      iVar21 = (pIVar3->VtxBuffer).Size;
      ImDrawList::PathArcTo(pIVar3,&local_1c8,local_78,fVar28,fVar42,local_c8._0_4_);
      ImDrawList::AddPolyline
                (pIVar3,(pIVar3->_Path).Data,(pIVar3->_Path).Size,(ImU32)local_230,0,local_22c);
      (pIVar3->_Path).Size = 0;
      iVar27 = (pIVar3->VtxBuffer).Size;
      _local_218 = ZEXT416((uint)local_1c8.x);
      local_228._0_4_ = cosf(local_1d8.x);
      local_228._4_4_ = extraout_XMM0_Db_02;
      fStack_220 = (float)extraout_XMM0_Dc_02;
      fStack_21c = (float)extraout_XMM0_Dd_02;
      auVar36._4_4_ = local_1c8.y;
      auVar36._0_4_ = local_218._0_4_;
      auVar36._8_4_ = local_218._4_4_;
      auVar36._12_4_ = 0;
      _local_218 = auVar36;
      fVar28 = sinf(local_1d8.x);
      fVar42 = (float)local_228._4_4_ * fStack_b0;
      local_228._4_4_ = fVar28 * (float)local_b8._4_4_ + (float)local_218._4_4_;
      local_228._0_4_ = (float)local_228._0_4_ * (float)local_b8._0_4_ + (float)local_218._0_4_;
      fStack_220 = fVar42 + (float)uStack_210;
      fStack_21c = extraout_XMM0_Db_03 * fStack_ac + uStack_210._4_4_;
      _local_218 = ZEXT416((uint)local_1c8.x);
      local_1d8.x = cosf((float)local_1f8._0_4_);
      local_1d8.y = extraout_XMM0_Db_04;
      uStack_1d0 = CONCAT44(extraout_XMM0_Dd_03,extraout_XMM0_Dc_03);
      auVar37._4_4_ = local_1c8.y;
      auVar37._0_4_ = local_218._0_4_;
      auVar37._8_4_ = local_218._4_4_;
      auVar37._12_4_ = 0;
      _local_218 = auVar37;
      fVar28 = sinf((float)local_1f8._0_4_);
      IVar33.x = local_1d8.x * (float)local_b8._0_4_ + (float)local_218._0_4_;
      IVar33.y = fVar28 * (float)local_b8._4_4_ + (float)local_218._4_4_;
      fVar28 = (&local_188.y)[lVar24];
      lVar24 = lVar24 + 1;
      ShadeVertsLinearColorGradientKeepAlpha
                (pIVar3,iVar21,iVar27,(ImVec2)local_228,IVar33,(ImU32)fVar38,(ImU32)fVar28);
      fVar38 = fVar28;
    } while (lVar24 != 6);
    local_228._0_4_ = cosf((local_248 + local_248) * 3.1415927);
    local_228._4_4_ = extraout_XMM0_Db_05;
    fStack_220 = (float)extraout_XMM0_Dc_04;
    fStack_21c = (float)extraout_XMM0_Dd_04;
    local_218._0_4_ = sinf((local_248 + local_248) * 3.1415927);
    IVar16 = local_dc;
    pIVar3 = local_198;
    col_00 = local_200;
    fVar38 = local_230;
    local_218._4_4_ = extraout_XMM0_Db_06;
    uStack_210._0_4_ = (float)extraout_XMM0_Dc_05;
    uStack_210._4_4_ = (float)extraout_XMM0_Dd_05;
    local_168._0_4_ = (float)local_228._0_4_ * (float)local_98._0_4_ * 0.5 + local_1c8.x;
    local_168._4_4_ = (float)local_218._0_4_ * (float)local_98._0_4_ * 0.5 + local_1c8.y;
    if ((char)local_23c == '\0') {
      fVar28 = 0.55;
    }
    else {
      fVar28 = 0.65;
    }
    local_22c = local_22c * fVar28;
    iVar21 = 0x20;
    if ((int)(local_22c / 1.4) < 0x20) {
      iVar21 = (int)(local_22c / 1.4);
    }
    iVar27 = 9;
    if (9 < iVar21) {
      iVar27 = iVar21;
    }
    ImDrawList::AddCircleFilled(local_198,(ImVec2 *)local_168,local_22c,local_dc,iVar27);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)local_168,local_22c + 1.0,local_d8._0_4_,iVar27,1.0);
    ImDrawList::AddCircle(pIVar3,(ImVec2 *)local_168,local_22c,(ImU32)fVar38,iVar27,1.0);
    uVar12 = local_218._0_4_;
    uVar13 = local_218._4_4_;
    uVar10 = local_228._0_4_;
    uVar11 = local_228._4_4_;
    fVar28 = (float)local_228._4_4_ * 0.0;
    fVar42 = (float)local_228._4_4_ * 0.0;
    local_1f8._0_4_ = local_1c8.x;
    local_118.x = local_1b0.x * (float)local_228._0_4_ + -local_1b0.y * (float)local_218._0_4_ +
                  (float)local_1f8._0_4_;
    local_1f8._4_4_ = local_1c8.y;
    local_118.y = local_1b0.x * (float)local_218._0_4_ + local_1b0.y * (float)local_228._0_4_ +
                  (float)local_1f8._4_4_;
    local_228._4_4_ = local_118.y;
    local_228._0_4_ = local_118.x;
    fStack_220 = (float)local_218._4_4_ * 0.0 + (float)local_218._4_4_ * -0.0 + 0.0;
    fStack_21c = fVar42 + fVar28 + 0.0;
    fVar28 = (float)local_218._4_4_ * -0.0;
    fVar46 = (float)local_218._4_4_ * 0.0;
    fVar42 = local_190.x * (float)uVar10 + -local_190.y * (float)local_218._0_4_ +
             (float)local_1f8._0_4_;
    local_218._4_4_ =
         local_190.x * (float)local_218._0_4_ + local_190.y * (float)uVar10 + (float)local_1f8._4_4_
    ;
    local_218._0_4_ = fVar42;
    uStack_210._0_4_ = fVar46 + fVar28 + 0.0;
    uStack_210._4_4_ = (float)uVar11 * 0.0 + (float)uVar11 * 0.0 + 0.0;
    local_38.y = (float)local_218._4_4_;
    local_38.x = fVar42;
    local_1f8._0_4_ =
         local_1b8.x * (float)uVar10 + -local_1b8.y * (float)uVar12 + (float)local_1f8._0_4_;
    local_1f8._4_4_ =
         local_1b8.x * (float)uVar12 + local_1b8.y * (float)uVar10 + (float)local_1f8._4_4_;
    fStack_1f0 = (float)uVar13 * 0.0 + (float)uVar13 * -0.0 + 0.0;
    fStack_1ec = (float)uVar11 * 0.0 + (float)uVar11 * 0.0 + 0.0;
    local_40.y = (float)local_1f8._4_4_;
    local_40.x = (float)local_1f8._0_4_;
    local_1d8 = GetFontTexUvWhitePixel();
    uStack_1d0 = extraout_XMM0_Qb;
    ImDrawList::PrimReserve(pIVar3,6,6);
    auVar5 = _local_1f8;
    auVar7 = _local_218;
    auVar45 = _local_228;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)pIVar3->_VtxCurrentIdx;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    pIVar4 = pIVar3->_VtxWritePtr;
    (pIVar4->pos).x = (float)local_228._0_4_;
    (pIVar4->pos).y = (float)local_228._4_4_;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = IVar16;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    uVar22 = pIVar3->_VtxCurrentIdx + 1;
    pIVar3->_VtxCurrentIdx = uVar22;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)uVar22;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    pIVar4 = pIVar3->_VtxWritePtr;
    (pIVar4->pos).x = (float)local_218._0_4_;
    (pIVar4->pos).y = (float)local_218._4_4_;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = IVar16;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    uVar22 = pIVar3->_VtxCurrentIdx + 1;
    pIVar3->_VtxCurrentIdx = uVar22;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)uVar22;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    pIVar4 = pIVar3->_VtxWritePtr;
    (pIVar4->pos).x = (float)local_1f8._0_4_;
    (pIVar4->pos).y = (float)local_1f8._4_4_;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = (ImU32)fVar38;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    uVar22 = pIVar3->_VtxCurrentIdx + 1;
    pIVar3->_VtxCurrentIdx = uVar22;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)uVar22;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    IVar17.y = local_118.y;
    IVar17.x = local_118.x;
    pIVar3->_VtxWritePtr->pos = IVar17;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = 0;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    uVar22 = pIVar3->_VtxCurrentIdx + 1;
    pIVar3->_VtxCurrentIdx = uVar22;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)uVar22;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    pIVar3->_VtxWritePtr->pos = local_38;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = (ImU32)local_a0;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    uVar22 = pIVar3->_VtxCurrentIdx + 1;
    pIVar3->_VtxCurrentIdx = uVar22;
    *pIVar3->_IdxWritePtr = (ImDrawIdx)uVar22;
    pIVar3->_IdxWritePtr = pIVar3->_IdxWritePtr + 1;
    pIVar3->_VtxWritePtr->pos = local_40;
    pIVar3->_VtxWritePtr->uv = local_1d8;
    pIVar3->_VtxWritePtr->col = 0;
    pIVar3->_VtxWritePtr = pIVar3->_VtxWritePtr + 1;
    pIVar3->_VtxCurrentIdx = pIVar3->_VtxCurrentIdx + 1;
    _local_228 = auVar45;
    _local_218 = auVar7;
    _local_1f8 = auVar5;
    ImDrawList::AddTriangle(pIVar3,&local_118,&local_38,&local_40,local_d8._0_4_,1.5);
    fVar38 = 1.0;
    if (local_244 <= 1.0) {
      fVar38 = local_244;
    }
    fVar38 = (float)(~-(uint)(local_244 < 0.0) & (uint)fVar38);
    fVar42 = 1.0 - local_240;
    fVar28 = 1.0;
    if (fVar42 <= 1.0) {
      fVar28 = fVar42;
    }
    fVar28 = (float)(~-(uint)(fVar42 < 0.0) & (uint)fVar28);
    fVar42 = fVar38 * (local_118.x - local_40.x) + local_40.x;
    fVar38 = fVar38 * (local_118.y - local_40.y) + local_40.y;
    local_110.x = fVar28 * (local_38.x - fVar42) + fVar42;
    local_110.y = fVar28 * (local_38.y - fVar38) + fVar38;
    IVar16 = local_1c0;
  }
  uVar22 = local_13c;
  pIVar3 = local_198;
  if (local_138[0] == '\0') {
    fVar38 = 6.0;
  }
  else {
    fVar38 = 10.0;
  }
  local_228._0_4_ = fVar38;
  ImDrawList::AddCircleFilled(local_198,&local_110,fVar38,IVar16,0xc);
  ImDrawList::AddCircle(pIVar3,&local_110,(float)local_228._0_4_ + 1.0,local_d8._0_4_,0xc,1.0);
  ImDrawList::AddCircle(pIVar3,&local_110,(float)local_228._0_4_,(ImU32)local_230,0xc,1.0);
  if (local_1bc == 0x10000) {
    fVar38 = col_00[1].y;
    _local_218 = ZEXT416((uint)fVar38);
    fVar28 = 1.0;
    if (fVar38 <= 1.0) {
      fVar28 = fVar38;
    }
    _local_228 = ZEXT416((uint)(1.0 - fVar28));
    local_168._4_4_ = local_148.y;
    local_168._0_4_ = local_128._0_4_;
    local_160.x = (float)local_128._0_4_ + (float)local_158._0_4_;
    local_160.y = local_148.y + (float)local_1a8._0_4_;
    RenderColorRectWithAlphaCheckerboard
              (pIVar3,(ImVec2)local_168,local_160,0,(local_160.x - (float)local_128._0_4_) * 0.5,
               (ImVec2)0x0,0.0,0);
    ImDrawList::AddRectFilledMultiColor
              (pIVar3,(ImVec2 *)local_168,&local_160,IVar16,IVar16,IVar16 & 0xffffff,
               IVar16 & 0xffffff);
    local_228._4_4_ = (float)(int)(float)(~local_218._4_4_ & local_228._4_4_);
    local_228._0_4_ =
         (float)(int)((float)(-(uint)((float)local_218._0_4_ < 0.0) & 0x3f800000 |
                             ~-(uint)((float)local_218._0_4_ < 0.0) & local_228._0_4_) *
                      (float)local_1a8._0_4_ + local_148.y + 0.5);
    fStack_220 = (float)(int)(float)(~(uint)(float)uStack_210 & (uint)fStack_220);
    fStack_21c = (float)(int)(float)(~(uint)uStack_210._4_4_ & (uint)fStack_21c);
    RenderFrameBorder((ImVec2)local_168,local_160,0.0);
    pos_00.x = (float)local_128._0_4_ + -1.0;
    pos_00.y = (float)local_228._0_4_;
    half_sz_00.x = local_68 + 1.0;
    half_sz_00.y = local_68;
    RenderArrowsForVerticalBar
              (pIVar3,pos_00,half_sz_00,(float)local_158._0_4_ + 2.0,(local_238->Style).Alpha);
  }
  EndGroup();
  if ((char)uVar22 != '\0') {
    iVar21 = bcmp(local_58,col_00,local_a8);
    uVar22 = uVar22 & 0xff;
    if (iVar21 == 0) {
      uVar22 = 0;
    }
  }
  bVar18 = (byte)uVar22;
  if (((uVar22 & 1) != 0) && (id = (local_238->LastItemData).ID, id != 0)) {
    MarkItemEdited(id);
  }
  PopID();
LAB_002203de:
  return (bool)(bVar18 & 1);
}

Assistant:

bool ImGui::ColorPicker4(const char* label, float col[4], ImGuiColorEditFlags flags, const float* ref_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImDrawList* draw_list = window->DrawList;
    ImGuiStyle& style = g.Style;
    ImGuiIO& io = g.IO;

    const float width = CalcItemWidth();
    g.NextItemData.ClearFlags();

    PushID(label);
    BeginGroup();

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
        flags |= ImGuiColorEditFlags_NoSmallPreview;

    // Context menu: display and store options.
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        ColorPickerOptionsPopup(col, flags);

    // Read stored options
    if (!(flags & ImGuiColorEditFlags_PickerMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_PickerMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_PickerMask_;
    if (!(flags & ImGuiColorEditFlags_InputMask_))
        flags |= ((g.ColorEditOptions & ImGuiColorEditFlags_InputMask_) ? g.ColorEditOptions : ImGuiColorEditFlags_DefaultOptions_) & ImGuiColorEditFlags_InputMask_;
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_PickerMask_)); // Check that only 1 is selected
    IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiColorEditFlags_InputMask_));  // Check that only 1 is selected
    if (!(flags & ImGuiColorEditFlags_NoOptions))
        flags |= (g.ColorEditOptions & ImGuiColorEditFlags_AlphaBar);

    // Setup
    int components = (flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4;
    bool alpha_bar = (flags & ImGuiColorEditFlags_AlphaBar) && !(flags & ImGuiColorEditFlags_NoAlpha);
    ImVec2 picker_pos = window->DC.CursorPos;
    float square_sz = GetFrameHeight();
    float bars_width = square_sz; // Arbitrary smallish width of Hue/Alpha picking bars
    float sv_picker_size = ImMax(bars_width * 1, width - (alpha_bar ? 2 : 1) * (bars_width + style.ItemInnerSpacing.x)); // Saturation/Value picking box
    float bar0_pos_x = picker_pos.x + sv_picker_size + style.ItemInnerSpacing.x;
    float bar1_pos_x = bar0_pos_x + bars_width + style.ItemInnerSpacing.x;
    float bars_triangles_half_sz = IM_FLOOR(bars_width * 0.20f);

    float backup_initial_col[4];
    memcpy(backup_initial_col, col, components * sizeof(float));

    float wheel_thickness = sv_picker_size * 0.08f;
    float wheel_r_outer = sv_picker_size * 0.50f;
    float wheel_r_inner = wheel_r_outer - wheel_thickness;
    ImVec2 wheel_center(picker_pos.x + (sv_picker_size + bars_width)*0.5f, picker_pos.y + sv_picker_size * 0.5f);

    // Note: the triangle is displayed rotated with triangle_pa pointing to Hue, but most coordinates stays unrotated for logic.
    float triangle_r = wheel_r_inner - (int)(sv_picker_size * 0.027f);
    ImVec2 triangle_pa = ImVec2(triangle_r, 0.0f); // Hue point.
    ImVec2 triangle_pb = ImVec2(triangle_r * -0.5f, triangle_r * -0.866025f); // Black point.
    ImVec2 triangle_pc = ImVec2(triangle_r * -0.5f, triangle_r * +0.866025f); // White point.

    float H = col[0], S = col[1], V = col[2];
    float R = col[0], G = col[1], B = col[2];
    if (flags & ImGuiColorEditFlags_InputRGB)
    {
        // Hue is lost when converting from greyscale rgb (saturation=0). Restore it.
        ColorConvertRGBtoHSV(R, G, B, H, S, V);
        ColorEditRestoreHS(col, &H, &S, &V);
    }
    else if (flags & ImGuiColorEditFlags_InputHSV)
    {
        ColorConvertHSVtoRGB(H, S, V, R, G, B);
    }

    bool value_changed = false, value_changed_h = false, value_changed_sv = false;

    PushItemFlag(ImGuiItemFlags_NoNav, true);
    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Hue wheel + SV triangle logic
        InvisibleButton("hsv", ImVec2(sv_picker_size + style.ItemInnerSpacing.x + bars_width, sv_picker_size));
        if (IsItemActive())
        {
            ImVec2 initial_off = g.IO.MouseClickedPos[0] - wheel_center;
            ImVec2 current_off = g.IO.MousePos - wheel_center;
            float initial_dist2 = ImLengthSqr(initial_off);
            if (initial_dist2 >= (wheel_r_inner - 1) * (wheel_r_inner - 1) && initial_dist2 <= (wheel_r_outer + 1) * (wheel_r_outer + 1))
            {
                // Interactive with Hue wheel
                H = ImAtan2(current_off.y, current_off.x) / IM_PI * 0.5f;
                if (H < 0.0f)
                    H += 1.0f;
                value_changed = value_changed_h = true;
            }
            float cos_hue_angle = ImCos(-H * 2.0f * IM_PI);
            float sin_hue_angle = ImSin(-H * 2.0f * IM_PI);
            if (ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, ImRotate(initial_off, cos_hue_angle, sin_hue_angle)))
            {
                // Interacting with SV triangle
                ImVec2 current_off_unrotated = ImRotate(current_off, cos_hue_angle, sin_hue_angle);
                if (!ImTriangleContainsPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated))
                    current_off_unrotated = ImTriangleClosestPoint(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated);
                float uu, vv, ww;
                ImTriangleBarycentricCoords(triangle_pa, triangle_pb, triangle_pc, current_off_unrotated, uu, vv, ww);
                V = ImClamp(1.0f - vv, 0.0001f, 1.0f);
                S = ImClamp(uu / V, 0.0001f, 1.0f);
                value_changed = value_changed_sv = true;
            }
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // SV rectangle logic
        InvisibleButton("sv", ImVec2(sv_picker_size, sv_picker_size));
        if (IsItemActive())
        {
            S = ImSaturate((io.MousePos.x - picker_pos.x) / (sv_picker_size - 1));
            V = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));

            // Greatly reduces hue jitter and reset to 0 when hue == 255 and color is rapidly modified using SV square.
            if (g.ColorEditLastColor == ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0)))
                H = g.ColorEditLastHue;
            value_changed = value_changed_sv = true;
        }
        if (!(flags & ImGuiColorEditFlags_NoOptions))
            OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);

        // Hue bar logic
        SetCursorScreenPos(ImVec2(bar0_pos_x, picker_pos.y));
        InvisibleButton("hue", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            H = ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = value_changed_h = true;
        }
    }

    // Alpha bar logic
    if (alpha_bar)
    {
        SetCursorScreenPos(ImVec2(bar1_pos_x, picker_pos.y));
        InvisibleButton("alpha", ImVec2(bars_width, sv_picker_size));
        if (IsItemActive())
        {
            col[3] = 1.0f - ImSaturate((io.MousePos.y - picker_pos.y) / (sv_picker_size - 1));
            value_changed = true;
        }
    }
    PopItemFlag(); // ImGuiItemFlags_NoNav

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        SameLine(0, style.ItemInnerSpacing.x);
        BeginGroup();
    }

    if (!(flags & ImGuiColorEditFlags_NoLabel))
    {
        const char* label_display_end = FindRenderedTextEnd(label);
        if (label != label_display_end)
        {
            if ((flags & ImGuiColorEditFlags_NoSidePreview))
                SameLine(0, style.ItemInnerSpacing.x);
            TextEx(label, label_display_end);
        }
    }

    if (!(flags & ImGuiColorEditFlags_NoSidePreview))
    {
        PushItemFlag(ImGuiItemFlags_NoNavDefaultFocus, true);
        ImVec4 col_v4(col[0], col[1], col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : col[3]);
        if ((flags & ImGuiColorEditFlags_NoLabel))
            Text("Current");

        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf | ImGuiColorEditFlags_NoTooltip;
        ColorButton("##current", col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2));
        if (ref_col != NULL)
        {
            Text("Original");
            ImVec4 ref_col_v4(ref_col[0], ref_col[1], ref_col[2], (flags & ImGuiColorEditFlags_NoAlpha) ? 1.0f : ref_col[3]);
            if (ColorButton("##original", ref_col_v4, (flags & sub_flags_to_forward), ImVec2(square_sz * 3, square_sz * 2)))
            {
                memcpy(col, ref_col, components * sizeof(float));
                value_changed = true;
            }
        }
        PopItemFlag();
        EndGroup();
    }

    // Convert back color to RGB
    if (value_changed_h || value_changed_sv)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            ColorConvertHSVtoRGB(H, S, V, col[0], col[1], col[2]);
            g.ColorEditLastHue = H;
            g.ColorEditLastSat = S;
            g.ColorEditLastColor = ColorConvertFloat4ToU32(ImVec4(col[0], col[1], col[2], 0));
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            col[0] = H;
            col[1] = S;
            col[2] = V;
        }
    }

    // R,G,B and H,S,V slider color editor
    bool value_changed_fix_hue_wrap = false;
    if ((flags & ImGuiColorEditFlags_NoInputs) == 0)
    {
        PushItemWidth((alpha_bar ? bar1_pos_x : bar0_pos_x) + bars_width - picker_pos.x);
        ImGuiColorEditFlags sub_flags_to_forward = ImGuiColorEditFlags_DataTypeMask_ | ImGuiColorEditFlags_InputMask_ | ImGuiColorEditFlags_HDR | ImGuiColorEditFlags_NoAlpha | ImGuiColorEditFlags_NoOptions | ImGuiColorEditFlags_NoSmallPreview | ImGuiColorEditFlags_AlphaPreview | ImGuiColorEditFlags_AlphaPreviewHalf;
        ImGuiColorEditFlags sub_flags = (flags & sub_flags_to_forward) | ImGuiColorEditFlags_NoPicker;
        if (flags & ImGuiColorEditFlags_DisplayRGB || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            if (ColorEdit4("##rgb", col, sub_flags | ImGuiColorEditFlags_DisplayRGB))
            {
                // FIXME: Hackily differentiating using the DragInt (ActiveId != 0 && !ActiveIdAllowOverlap) vs. using the InputText or DropTarget.
                // For the later we don't want to run the hue-wrap canceling code. If you are well versed in HSV picker please provide your input! (See #2050)
                value_changed_fix_hue_wrap = (g.ActiveId != 0 && !g.ActiveIdAllowOverlap);
                value_changed = true;
            }
        if (flags & ImGuiColorEditFlags_DisplayHSV || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hsv", col, sub_flags | ImGuiColorEditFlags_DisplayHSV);
        if (flags & ImGuiColorEditFlags_DisplayHex || (flags & ImGuiColorEditFlags_DisplayMask_) == 0)
            value_changed |= ColorEdit4("##hex", col, sub_flags | ImGuiColorEditFlags_DisplayHex);
        PopItemWidth();
    }

    // Try to cancel hue wrap (after ColorEdit4 call), if any
    if (value_changed_fix_hue_wrap && (flags & ImGuiColorEditFlags_InputRGB))
    {
        float new_H, new_S, new_V;
        ColorConvertRGBtoHSV(col[0], col[1], col[2], new_H, new_S, new_V);
        if (new_H <= 0 && H > 0)
        {
            if (new_V <= 0 && V != new_V)
                ColorConvertHSVtoRGB(H, S, new_V <= 0 ? V * 0.5f : new_V, col[0], col[1], col[2]);
            else if (new_S <= 0)
                ColorConvertHSVtoRGB(H, new_S <= 0 ? S * 0.5f : new_S, new_V, col[0], col[1], col[2]);
        }
    }

    if (value_changed)
    {
        if (flags & ImGuiColorEditFlags_InputRGB)
        {
            R = col[0];
            G = col[1];
            B = col[2];
            ColorConvertRGBtoHSV(R, G, B, H, S, V);
            ColorEditRestoreHS(col, &H, &S, &V);   // Fix local Hue as display below will use it immediately.
        }
        else if (flags & ImGuiColorEditFlags_InputHSV)
        {
            H = col[0];
            S = col[1];
            V = col[2];
            ColorConvertHSVtoRGB(H, S, V, R, G, B);
        }
    }

    const int style_alpha8 = IM_F32_TO_INT8_SAT(style.Alpha);
    const ImU32 col_black = IM_COL32(0,0,0,style_alpha8);
    const ImU32 col_white = IM_COL32(255,255,255,style_alpha8);
    const ImU32 col_midgrey = IM_COL32(128,128,128,style_alpha8);
    const ImU32 col_hues[6 + 1] = { IM_COL32(255,0,0,style_alpha8), IM_COL32(255,255,0,style_alpha8), IM_COL32(0,255,0,style_alpha8), IM_COL32(0,255,255,style_alpha8), IM_COL32(0,0,255,style_alpha8), IM_COL32(255,0,255,style_alpha8), IM_COL32(255,0,0,style_alpha8) };

    ImVec4 hue_color_f(1, 1, 1, style.Alpha); ColorConvertHSVtoRGB(H, 1, 1, hue_color_f.x, hue_color_f.y, hue_color_f.z);
    ImU32 hue_color32 = ColorConvertFloat4ToU32(hue_color_f);
    ImU32 user_col32_striped_of_alpha = ColorConvertFloat4ToU32(ImVec4(R, G, B, style.Alpha)); // Important: this is still including the main rendering/style alpha!!

    ImVec2 sv_cursor_pos;

    if (flags & ImGuiColorEditFlags_PickerHueWheel)
    {
        // Render Hue Wheel
        const float aeps = 0.5f / wheel_r_outer; // Half a pixel arc length in radians (2pi cancels out).
        const int segment_per_arc = ImMax(4, (int)wheel_r_outer / 12);
        for (int n = 0; n < 6; n++)
        {
            const float a0 = (n)     /6.0f * 2.0f * IM_PI - aeps;
            const float a1 = (n+1.0f)/6.0f * 2.0f * IM_PI + aeps;
            const int vert_start_idx = draw_list->VtxBuffer.Size;
            draw_list->PathArcTo(wheel_center, (wheel_r_inner + wheel_r_outer)*0.5f, a0, a1, segment_per_arc);
            draw_list->PathStroke(col_white, 0, wheel_thickness);
            const int vert_end_idx = draw_list->VtxBuffer.Size;

            // Paint colors over existing vertices
            ImVec2 gradient_p0(wheel_center.x + ImCos(a0) * wheel_r_inner, wheel_center.y + ImSin(a0) * wheel_r_inner);
            ImVec2 gradient_p1(wheel_center.x + ImCos(a1) * wheel_r_inner, wheel_center.y + ImSin(a1) * wheel_r_inner);
            ShadeVertsLinearColorGradientKeepAlpha(draw_list, vert_start_idx, vert_end_idx, gradient_p0, gradient_p1, col_hues[n], col_hues[n + 1]);
        }

        // Render Cursor + preview on Hue Wheel
        float cos_hue_angle = ImCos(H * 2.0f * IM_PI);
        float sin_hue_angle = ImSin(H * 2.0f * IM_PI);
        ImVec2 hue_cursor_pos(wheel_center.x + cos_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f, wheel_center.y + sin_hue_angle * (wheel_r_inner + wheel_r_outer) * 0.5f);
        float hue_cursor_rad = value_changed_h ? wheel_thickness * 0.65f : wheel_thickness * 0.55f;
        int hue_cursor_segments = ImClamp((int)(hue_cursor_rad / 1.4f), 9, 32);
        draw_list->AddCircleFilled(hue_cursor_pos, hue_cursor_rad, hue_color32, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad + 1, col_midgrey, hue_cursor_segments);
        draw_list->AddCircle(hue_cursor_pos, hue_cursor_rad, col_white, hue_cursor_segments);

        // Render SV triangle (rotated according to hue)
        ImVec2 tra = wheel_center + ImRotate(triangle_pa, cos_hue_angle, sin_hue_angle);
        ImVec2 trb = wheel_center + ImRotate(triangle_pb, cos_hue_angle, sin_hue_angle);
        ImVec2 trc = wheel_center + ImRotate(triangle_pc, cos_hue_angle, sin_hue_angle);
        ImVec2 uv_white = GetFontTexUvWhitePixel();
        draw_list->PrimReserve(6, 6);
        draw_list->PrimVtx(tra, uv_white, hue_color32);
        draw_list->PrimVtx(trb, uv_white, hue_color32);
        draw_list->PrimVtx(trc, uv_white, col_white);
        draw_list->PrimVtx(tra, uv_white, 0);
        draw_list->PrimVtx(trb, uv_white, col_black);
        draw_list->PrimVtx(trc, uv_white, 0);
        draw_list->AddTriangle(tra, trb, trc, col_midgrey, 1.5f);
        sv_cursor_pos = ImLerp(ImLerp(trc, tra, ImSaturate(S)), trb, ImSaturate(1 - V));
    }
    else if (flags & ImGuiColorEditFlags_PickerHueBar)
    {
        // Render SV Square
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), col_white, hue_color32, hue_color32, col_white);
        draw_list->AddRectFilledMultiColor(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0, 0, col_black, col_black);
        RenderFrameBorder(picker_pos, picker_pos + ImVec2(sv_picker_size, sv_picker_size), 0.0f);
        sv_cursor_pos.x = ImClamp(IM_ROUND(picker_pos.x + ImSaturate(S)     * sv_picker_size), picker_pos.x + 2, picker_pos.x + sv_picker_size - 2); // Sneakily prevent the circle to stick out too much
        sv_cursor_pos.y = ImClamp(IM_ROUND(picker_pos.y + ImSaturate(1 - V) * sv_picker_size), picker_pos.y + 2, picker_pos.y + sv_picker_size - 2);

        // Render Hue Bar
        for (int i = 0; i < 6; ++i)
            draw_list->AddRectFilledMultiColor(ImVec2(bar0_pos_x, picker_pos.y + i * (sv_picker_size / 6)), ImVec2(bar0_pos_x + bars_width, picker_pos.y + (i + 1) * (sv_picker_size / 6)), col_hues[i], col_hues[i], col_hues[i + 1], col_hues[i + 1]);
        float bar0_line_y = IM_ROUND(picker_pos.y + H * sv_picker_size);
        RenderFrameBorder(ImVec2(bar0_pos_x, picker_pos.y), ImVec2(bar0_pos_x + bars_width, picker_pos.y + sv_picker_size), 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar0_pos_x - 1, bar0_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    // Render cursor/preview circle (clamp S/V within 0..1 range because floating points colors may lead HSV values to be out of range)
    float sv_cursor_rad = value_changed_sv ? 10.0f : 6.0f;
    draw_list->AddCircleFilled(sv_cursor_pos, sv_cursor_rad, user_col32_striped_of_alpha, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad + 1, col_midgrey, 12);
    draw_list->AddCircle(sv_cursor_pos, sv_cursor_rad, col_white, 12);

    // Render alpha bar
    if (alpha_bar)
    {
        float alpha = ImSaturate(col[3]);
        ImRect bar1_bb(bar1_pos_x, picker_pos.y, bar1_pos_x + bars_width, picker_pos.y + sv_picker_size);
        RenderColorRectWithAlphaCheckerboard(draw_list, bar1_bb.Min, bar1_bb.Max, 0, bar1_bb.GetWidth() / 2.0f, ImVec2(0.0f, 0.0f));
        draw_list->AddRectFilledMultiColor(bar1_bb.Min, bar1_bb.Max, user_col32_striped_of_alpha, user_col32_striped_of_alpha, user_col32_striped_of_alpha & ~IM_COL32_A_MASK, user_col32_striped_of_alpha & ~IM_COL32_A_MASK);
        float bar1_line_y = IM_ROUND(picker_pos.y + (1.0f - alpha) * sv_picker_size);
        RenderFrameBorder(bar1_bb.Min, bar1_bb.Max, 0.0f);
        RenderArrowsForVerticalBar(draw_list, ImVec2(bar1_pos_x - 1, bar1_line_y), ImVec2(bars_triangles_half_sz + 1, bars_triangles_half_sz), bars_width + 2.0f, style.Alpha);
    }

    EndGroup();

    if (value_changed && memcmp(backup_initial_col, col, components * sizeof(float)) == 0)
        value_changed = false;
    if (value_changed && g.LastItemData.ID != 0) // In case of ID collision, the second EndGroup() won't catch g.ActiveId
        MarkItemEdited(g.LastItemData.ID);

    PopID();

    return value_changed;
}